

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O2

void __thiscall rengine::Node::~Node(Node *this)

{
  (this->super_SignalEmitter)._vptr_SignalEmitter = (_func_int **)&PTR__Node_0012eac0;
  if (this->m_parent != (Node *)0x0) {
    remove(this->m_parent,(char *)this);
  }
  while (this->m_child != (Node *)0x0) {
    (*(this->m_child->super_SignalEmitter)._vptr_SignalEmitter[2])();
  }
  SignalEmitter::~SignalEmitter(&this->super_SignalEmitter);
  return;
}

Assistant:

virtual ~Node() {
        if (m_parent)
            m_parent->remove(this);
        while (m_child)
            m_child->destroy();
    }